

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseUnary(Parser *this)

{
  Mark MVar1;
  undefined8 uVar2;
  UnaryOperator UVar3;
  Mark *pMVar4;
  Token *pTVar5;
  istream *piVar6;
  pointer *__ptr;
  Tokenizer *in_RSI;
  Parser *this_00;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> term;
  Token token;
  undefined1 local_a8 [16];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_98;
  Mark local_70;
  Token local_68;
  
  this_00 = (Parser *)local_a8;
  pMVar4 = Stream::getMark(&in_RSI->stream_);
  MVar1 = *pMVar4;
  pTVar5 = Tokenizer::peek(in_RSI);
  local_a8._8_4_ = pTVar5->type;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&local_98,
                    (_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&pTVar5->value);
  local_70 = pTVar5->mark;
  if ((local_a8._8_4_ == BinaryNot) || (local_a8._8_4_ == Minus)) {
    Tokenizer::nextToken(&local_68,in_RSI);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
      ::_S_vtable._M_arr
      [local_68.value.
       super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
       .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
       super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
       super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
       super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
       super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
              ((anon_class_1_0_00000001 *)local_a8,&local_68.value);
    local_68.value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index = 0xff;
    UVar3 = unaryOperatorFromToken(this_00,(Token *)(local_a8 + 8));
    parseTerm((Parser *)local_a8);
    piVar6 = (istream *)operator_new(0x20);
    uVar2 = local_a8._0_8_;
    local_a8._0_8_ = (istream *)0x0;
    *(undefined ***)piVar6 = &PTR__UnaryNode_001f4db8;
    *(UnaryOperator *)(piVar6 + 0x10) = UVar3;
    *(undefined8 *)(piVar6 + 0x18) = uVar2;
    *(Mark *)(piVar6 + 8) = MVar1;
    (this->tokenizer_).stream_.is_ = piVar6;
  }
  else {
    parseTerm(this);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr
    [local_98.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
            ((anon_class_1_0_00000001 *)local_a8,&local_98);
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseUnary()
{
  const auto mark = tokenizer_.getMark();
  const auto token = tokenizer_.peek();
  if(token.type == TokenType::Minus || token.type == TokenType::BinaryNot)
  {
    tokenizer_.nextToken();
    const auto op = unaryOperatorFromToken(token);
    auto term = parseTerm();
    auto node = std::make_unique<UnaryNode>(op, std::move(term));
    node->setMark(mark);
    return node;
  }
  else
    return parseTerm();
}